

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O1

boolean landing_spot(coord *spot,int reason,int forceit)

{
  uint x;
  monst *pmVar1;
  int iVar2;
  bool bVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  trap *ptVar7;
  obj *poVar8;
  uint y;
  uint uVar9;
  bool bVar10;
  int local_60;
  
  if (((((reason != 6) || (u.uprops[0x1b].intrinsic != 0)) || (u.umonnum == 0x9e)) ||
      (((youmonst.data)->mlet == '\x1c' || (u.uprops[0x1c].intrinsic != 0)))) ||
     ((u.uprops[0x25].intrinsic != 0 || (iVar2 = 0, u.uprops[0x25].extrinsic != 0)))) {
    iVar2 = 1;
  }
  local_60 = -1;
  bVar3 = false;
  do {
    x = (int)u.ux - 1;
    if ((int)x <= u.ux + 1) {
      do {
        uVar5 = (uint)u.uy;
        if ((int)(uVar5 - 1) <= (int)(uVar5 + 1)) {
          y = uVar5 - 2;
          uVar9 = uVar5 - 1;
          do {
            y = y + 1;
            if (((((((x - 1 < 0x4f) && (y < 0x15)) && ((y != uVar5 || (x != (int)u.ux)))) &&
                  ('\x16' < level->locations[x][y].typ)) &&
                 (((pmVar1 = level->monsters[x][y], pmVar1 == (monst *)0x0 ||
                   ((pmVar1->field_0x61 & 2) != 0)) &&
                  (bVar4 = closed_door(level,x,y), bVar4 == '\0')))) &&
                (((iVar6 = dist2(x,y,(int)u.ux,(int)u.uy), local_60 < 0 || (iVar6 < local_60)) ||
                 ((iVar6 == local_60 && (uVar5 = mt_random(), (uVar5 & 1) != 0)))))) &&
               ((iVar2 != 0 ||
                (((ptVar7 = t_at(level,x,y), ptVar7 == (trap *)0x0 ||
                  ((ptVar7->field_0x8 & 0x20) == 0)) &&
                 ((poVar8 = sobj_at(0x214,level,x,y), poVar8 == (obj *)0x0 ||
                  (((youmonst.data)->mflags2 & 0x8000000) != 0)))))))) {
              spot->x = (xchar)x;
              spot->y = (char)uVar9;
              bVar3 = true;
              local_60 = iVar6;
            }
            uVar5 = (uint)u.uy;
            uVar9 = (uint)(byte)((char)uVar9 + 1);
          } while ((int)y <= (int)uVar5);
        }
        bVar10 = (int)x <= (int)u.ux;
        x = x + 1;
      } while (bVar10);
    }
  } while ((!bVar3) && (bVar10 = iVar2 == 0, iVar2 = iVar2 + 1, bVar10));
  if ((forceit != 0) &&
     ((local_60 < 0 && (bVar4 = enexto(spot,level,u.ux,u.uy,youmonst.data), bVar4 == '\0')))) {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static boolean landing_spot(coord *spot, /* landing position (we fill it in) */
			    int reason, 
			    int forceit)
{
    int i = 0, x, y, distance, min_distance = -1;
    boolean found = FALSE;
    struct trap *t;

    /* avoid known traps (i == 0) and boulders, but allow them as a backup */
    if (reason != DISMOUNT_BYCHOICE || Stunned || Confusion || Fumbling) i = 1;
    for (; !found && i < 2; ++i) {
	for (x = u.ux-1; x <= u.ux+1; x++)
	    for (y = u.uy-1; y <= u.uy+1; y++) {
		if (!isok(x, y) || (x == u.ux && y == u.uy)) continue;

		if (ACCESSIBLE(level->locations[x][y].typ) &&
			    !MON_AT(level, x,y) && !closed_door(level, x,y)) {
		    distance = distu(x,y);
		    if (min_distance < 0 || distance < min_distance ||
			    (distance == min_distance && rn2(2))) {
			if (i > 0 || (((t = t_at(level, x, y)) == 0 || !t->tseen) &&
				      (!sobj_at(BOULDER, level, x, y) ||
				       throws_rocks(youmonst.data)))) {
			    spot->x = x;
			    spot->y = y;
			    min_distance = distance;
			    found = TRUE;
			}
		    }
		}
	    }
    }

    /* If we didn't find a good spot and forceit is on, try enexto(). */
    if (forceit && min_distance < 0 &&
		!enexto(spot, level, u.ux, u.uy, youmonst.data))
	return FALSE;

    return found;
}